

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMap.c
# Opt level: O0

int If_ManCutAigDelay_rec(If_Man_t *p,If_Obj_t *pObj,Vec_Ptr_t *vVisited)

{
  int iVar1;
  int b;
  int local_34;
  int Delay1;
  int Delay0;
  Vec_Ptr_t *vVisited_local;
  If_Obj_t *pObj_local;
  If_Man_t *p_local;
  
  if ((*(uint *)pObj >> 9 & 1) == 0) {
    iVar1 = If_ObjIsCi(pObj);
    if ((iVar1 == 0) && (iVar1 = If_ObjIsConst1(pObj), iVar1 == 0)) {
      iVar1 = If_ObjIsAnd(pObj);
      if (iVar1 != 0) {
        *(uint *)pObj = *(uint *)pObj & 0xfffffdff | 0x200;
        Vec_PtrPush(vVisited,pObj);
        iVar1 = If_ManCutAigDelay_rec(p,pObj->pFanin0,vVisited);
        b = If_ManCutAigDelay_rec(p,pObj->pFanin1,vVisited);
        if ((iVar1 < 0) || (b < 0)) {
          local_34 = -1;
        }
        else {
          local_34 = Abc_MaxInt(iVar1,b);
          local_34 = local_34 + 1;
        }
        (pObj->field_22).iCopy = local_34;
        return (pObj->field_22).iCopy;
      }
      __assert_fail("If_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                    ,0x3a,"int If_ManCutAigDelay_rec(If_Man_t *, If_Obj_t *, Vec_Ptr_t *)");
    }
    p_local._4_4_ = -1;
  }
  else {
    p_local._4_4_ = (pObj->field_22).iCopy;
  }
  return p_local._4_4_;
}

Assistant:

int If_ManCutAigDelay_rec( If_Man_t * p, If_Obj_t * pObj, Vec_Ptr_t * vVisited )
{
    int Delay0, Delay1;
    if ( pObj->fVisit )
        return pObj->iCopy;
    if ( If_ObjIsCi(pObj) || If_ObjIsConst1(pObj) )
        return -1;
    // store the node in the structure by level
    assert( If_ObjIsAnd(pObj) );
    pObj->fVisit = 1;
    Vec_PtrPush( vVisited, pObj );
    Delay0 = If_ManCutAigDelay_rec( p, pObj->pFanin0, vVisited );
    Delay1 = If_ManCutAigDelay_rec( p, pObj->pFanin1, vVisited );
    pObj->iCopy = (Delay0 >= 0 && Delay1 >= 0) ? 1 + Abc_MaxInt(Delay0, Delay1) : -1;
    return pObj->iCopy;
}